

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app2.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  __type _Var1;
  reference pvVar2;
  ostream *poVar3;
  undefined1 local_78 [8];
  string s2;
  string s1;
  long li;
  float f;
  double d;
  int i;
  char **param_1_local;
  int param_0_local;
  
  operator____s_abi_cxx11_((string *)((long)&s2.field_2 + 8),"Hello",5);
  operator____s_abi_cxx11_((string *)local_78,"Hello",5);
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&s2.field_2 + 8),0);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ulong)pvVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      0);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ulong)pvVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&s2.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int, char* [])
{
//    const char* s1 = "Hello";
//    const char* s2 = "Hello";

    auto i = 10; // integer
    auto d = 10.5; // double
    auto f = 20.3f; // float
    auto li = 10l;
    auto s1 = "Hello"_s; //  std::string("Hello");
    auto s2 = "Hello"_s;
    std::cout << (size_t)&s1[0] << std::endl;
    std::cout << (size_t)&s2[0] << std::endl;
    std::cout << (s1 == s2) << std::endl;

    return 0;
}